

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tst_tapfail.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  undefined1 local_48 [8];
  tst_qpromise_tapfail tc;
  QCoreApplication local_28 [8];
  QCoreApplication app;
  char **argv_local;
  int argc_local;
  
  argv_local._4_4_ = 0;
  argv_local._0_4_ = argc;
  QTest::Internal::callInitMain<tst_qpromise_tapfail>();
  QCoreApplication::QCoreApplication(local_28,(int *)&argv_local,argv,0x60204);
  QCoreApplication::setAttribute(AA_Use96Dpi,true);
  tst_qpromise_tapfail::tst_qpromise_tapfail((tst_qpromise_tapfail *)local_48);
  QTest::setMainSourcePath
            ("/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/qpromise/tst_tapfail.cpp"
             ,
             "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/build_O0/tests/auto/qtpromise/qpromise"
            );
  argv_local._4_4_ = QTest::qExec((QObject *)local_48,(int)argv_local,argv);
  tst_qpromise_tapfail::~tst_qpromise_tapfail((tst_qpromise_tapfail *)local_48);
  QCoreApplication::~QCoreApplication(local_28);
  return argv_local._4_4_;
}

Assistant:

void tst_qpromise_tapfail::fulfilled()
{
    int value = -1;
    auto p = QtPromise::QPromise<int>::resolve(42).tapFail([&]() {
        value = 43;
    });

    QCOMPARE(waitForValue(p, 42), 42);
    QCOMPARE(p.isFulfilled(), true);
    QCOMPARE(value, -1);
}